

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

int nn_xbus_recv(nn_sockbase *self,nn_msg *msg)

{
  size_t sVar1;
  void *__s;
  undefined8 *puVar2;
  nn_sockbase *local_40;
  nn_pipe *local_38;
  nn_pipe *pipe;
  nn_xbus *xbus;
  nn_msg *pnStack_20;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_40 = self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_sockbase *)0x0;
  }
  pipe = (nn_pipe *)local_40;
  pnStack_20 = msg;
  msg_local = (nn_msg *)self;
  while( true ) {
    xbus._4_4_ = nn_fq_recv((nn_fq *)(pipe + 0x28),pnStack_20,&local_38);
    if (xbus._4_4_ < 0) {
      return xbus._4_4_;
    }
    sVar1 = nn_chunkref_size(&pnStack_20->sphdr);
    if (sVar1 == 0) break;
    nn_msg_term(pnStack_20);
  }
  nn_chunkref_term(&pnStack_20->sphdr);
  nn_chunkref_init(&pnStack_20->sphdr,8);
  __s = nn_chunkref_data(&pnStack_20->sphdr);
  memset(__s,0,8);
  puVar2 = (undefined8 *)nn_chunkref_data(&pnStack_20->sphdr);
  *puVar2 = local_38;
  return 0;
}

Assistant:

int nn_xbus_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xbus *xbus;
    struct nn_pipe *pipe;

    xbus = nn_cont (self, struct nn_xbus, sockbase);

    while (1) {

        /*  Get next message in fair-queued manner. */
        rc = nn_fq_recv (&xbus->inpipes, msg, &pipe);
        if (nn_slow (rc < 0))
            return rc;

        /*  The message should have no header. Drop malformed messages. */
        if (nn_chunkref_size (&msg->sphdr) == 0)
            break;
        nn_msg_term (msg);
    }

    /*  Add pipe ID to the message header. */
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, sizeof (uint64_t));
    memset (nn_chunkref_data (&msg->sphdr), 0, sizeof (uint64_t));
    memcpy (nn_chunkref_data (&msg->sphdr), &pipe, sizeof (pipe));

    return 0;
}